

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

int nuraft::buffer::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  buffer *in_stack_00000008;
  buffer *in_stack_00000010;
  ptr<buffer> *other;
  size_t in_stack_00000108;
  size_t in_stack_ffffffffffffffd8;
  buffer *in_stack_ffffffffffffffe0;
  
  size((buffer *)src);
  pos((buffer *)src);
  alloc(in_stack_00000108);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x116735);
  put(in_stack_00000010,in_stack_00000008);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11674e);
  pos(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return (int)dst;
}

Assistant:

ptr<buffer> buffer::copy(const buffer& buf) {
    ptr<buffer> other = alloc(buf.size() - buf.pos());
    other->put(buf);
    other->pos(0);
    return other;
}